

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

void __thiscall
ggml_backend_registry::unload_backend
          (ggml_backend_registry *this,ggml_backend_reg_t reg,bool silent)

{
  __normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  __position;
  undefined8 uVar1;
  __normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
  _Var2;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<ggml_backend_reg_entry*,std::vector<ggml_backend_reg_entry,std::allocator<ggml_backend_reg_entry>>>,__gnu_cxx::__ops::_Iter_pred<ggml_backend_registry::unload_backend(ggml_backend_reg*,bool)::_lambda(ggml_backend_reg_entry_const&)_1_>>
                         ((this->backends).
                          super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->backends).
                          super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish,reg);
  if (__position._M_current !=
      (this->backends).
      super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (!silent) {
      uVar1 = ggml_backend_reg_name(reg);
      ggml_log_internal(1,"%s: unloading %s backend\n","unload_backend",uVar1);
    }
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<ggml_backend_device**,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>,__gnu_cxx::__ops::_Iter_pred<ggml_backend_registry::unload_backend(ggml_backend_reg*,bool)::_lambda(ggml_backend_device*)_1_>>
                      ((__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                        )(this->devices).
                         super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                        )(this->devices).
                         super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_ggml_src_ggml_backend_reg_cpp:291:29)>
                        )reg);
    if (_Var2._M_current !=
        (this->devices).
        super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->devices).
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_finish = _Var2._M_current;
    }
    std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::_M_erase
              (&this->backends,(iterator)__position._M_current);
    return;
  }
  if (silent) {
    return;
  }
  ggml_log_internal(4,"%s: backend not found\n","unload_backend");
  return;
}

Assistant:

void unload_backend(ggml_backend_reg_t reg, bool silent) {
        auto it = std::find_if(backends.begin(), backends.end(),
                               [reg](const ggml_backend_reg_entry & entry) { return entry.reg == reg; });

        if (it == backends.end()) {
            if (!silent) {
                GGML_LOG_ERROR("%s: backend not found\n", __func__);
            }
            return;
        }

        if (!silent) {
            GGML_LOG_DEBUG("%s: unloading %s backend\n", __func__, ggml_backend_reg_name(reg));
        }

        // remove devices
        devices.erase(
            std::remove_if(devices.begin(), devices.end(),
                            [reg](ggml_backend_dev_t dev) { return ggml_backend_dev_backend_reg(dev) == reg; }),
            devices.end());

        // remove backend
        backends.erase(it);
    }